

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::invalid_layout_qualifiers
               (NegativeTestContext *ctx)

{
  RenderContext *pRVar1;
  pointer log;
  bool bVar2;
  ContextType ctxType;
  char *__s;
  size_t sVar3;
  long lVar4;
  ComputeSource compSource;
  ShaderProgram program_3;
  ostringstream compShaderSource;
  ShaderProgram program;
  undefined1 auStack_428 [8];
  uint local_420;
  value_type local_418;
  undefined1 local_3f8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8 [3];
  pointer local_380;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  bool bStack_338;
  undefined8 uStack_337;
  undefined1 local_328 [8];
  pointer local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [6];
  ios_base local_2b8 [8];
  ios_base local_2b0 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_298;
  undefined1 local_278 [208];
  undefined1 local_1a8 [16];
  Shader *local_198 [12];
  ios_base local_138 [264];
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  __s = glu::getGLSLVersionDeclaration(bVar2 | GLSL_VERSION_310_ES);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_428 + (int)*(undefined8 *)((long)local_328 + -0x18) + 0x100);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"}\n",2);
  std::__cxx11::stringbuf::str();
  local_420 = 5;
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_418,local_1a8._0_8_,local_1a8._8_8_ + local_1a8._0_8_);
  if ((Shader **)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,(ulong)((long)&local_198[0]->m_gl + 1));
  }
  pRVar1 = ctx->m_renderCtx;
  bStack_338 = false;
  uStack_337 = 0;
  local_348._M_allocated_capacity = 0;
  local_348._M_local_buf[8] = '\0';
  local_348._9_7_ = 0;
  memset(local_3f8,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3f8 + (ulong)local_420 * 0x18),&local_418);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1a8,pRVar1,(ProgramSources *)local_3f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_348);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_368);
  lVar4 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3f8 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  local_3f8._0_8_ = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3f8,
             "A link error is generated if the compute shader program does not contain an input layout qualifier specifying a fixed local group size."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_3f8);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8._0_8_ !=
      local_3e8) {
    operator_delete((void *)local_3f8._0_8_,(ulong)(local_3e8[0]._M_dataplus._M_p + 1));
  }
  verifyLinkError(ctx,(ShaderProgram *)local_1a8);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
  std::ios_base::~ios_base(local_2b8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_428 + (int)*(undefined8 *)((long)local_328 + -0x18) + 0x100);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_328,
             "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n",0x41);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_328,
             "layout(local_size_x = 2, local_size_y = 2, local_size_z = 2) in;\n",0x41);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"}\n",2);
  std::__cxx11::stringbuf::str();
  local_420 = 5;
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_418,local_1a8._0_8_,local_1a8._8_8_ + local_1a8._0_8_);
  if ((Shader **)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,(ulong)((long)&local_198[0]->m_gl + 1));
  }
  pRVar1 = ctx->m_renderCtx;
  bStack_338 = false;
  uStack_337 = 0;
  local_348._M_allocated_capacity = 0;
  local_348._M_local_buf[8] = '\0';
  local_348._9_7_ = 0;
  memset(local_3f8,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3f8 + (ulong)local_420 * 0x18),&local_418);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1a8,pRVar1,(ProgramSources *)local_3f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_348);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_368);
  lVar4 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3f8 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  local_3f8._0_8_ = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3f8,
             "A compile-time error is generated if a local work group size qualifier is declared more than once in the same shader."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_3f8);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8._0_8_ !=
      local_3e8) {
    operator_delete((void *)local_3f8._0_8_,(ulong)(local_3e8[0]._M_dataplus._M_p + 1));
  }
  verifyCompileError(ctx,(ShaderProgram *)local_1a8,SHADERTYPE_COMPUTE);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
  std::ios_base::~ios_base(local_2b8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_428 + (int)*(undefined8 *)((long)local_328 + -0x18) + 0x100);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_328,"out mediump vec4 fragColor;\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_328,
             "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n",0x41);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"}\n",2);
  std::__cxx11::stringbuf::str();
  local_420 = 5;
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_418,local_1a8._0_8_,local_1a8._8_8_ + local_1a8._0_8_);
  if ((Shader **)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,(ulong)((long)&local_198[0]->m_gl + 1));
  }
  pRVar1 = ctx->m_renderCtx;
  bStack_338 = false;
  uStack_337 = 0;
  local_348._M_allocated_capacity = 0;
  local_348._M_local_buf[8] = '\0';
  local_348._9_7_ = 0;
  memset(local_3f8,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3f8 + (ulong)local_420 * 0x18),&local_418);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1a8,pRVar1,(ProgramSources *)local_3f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_348);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_368);
  lVar4 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_3f8 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  local_3f8._0_8_ = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3f8,
             "A compile-time error is generated if a user defined output variable is declared in a compute shader."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_3f8);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8._0_8_ !=
      local_3e8) {
    operator_delete((void *)local_3f8._0_8_,(ulong)(local_3e8[0]._M_dataplus._M_p + 1));
  }
  verifyCompileError(ctx,(ShaderProgram *)local_1a8,SHADERTYPE_COMPUTE);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
  std::ios_base::~ios_base(local_2b8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_428 + (int)*(Shader **)(local_1a8._0_8_ + -0x18) + 0x280);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"uvec3 gl_NumWorkGroups;\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"uvec3 gl_WorkGroupSize;\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"uvec3 gl_WorkGroupID;\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"uvec3 gl_LocalInvocationID;\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"uvec3 gl_GlobalInvocationID;\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"uvec3 gl_LocalInvocationIndex;\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n",0x41);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  local_420 = 5;
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_418,local_328,
             (char *)((long)local_328 + (long)&local_320->_M_dataplus));
  if (local_328 != (undefined1  [8])local_318) {
    operator_delete((void *)local_328,local_318[0]._M_allocated_capacity + 1);
  }
  pRVar1 = ctx->m_renderCtx;
  local_278[0x10] = 0;
  local_278._17_8_ = 0;
  local_278._0_8_ = (pointer)0x0;
  local_278[8] = 0;
  local_278._9_7_ = 0;
  memset(local_328,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_328 + (ulong)local_420 * 0x18),&local_418);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_3f8,pRVar1,(ProgramSources *)local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_278);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_298);
  lVar4 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_328 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  local_328 = (undefined1  [8])local_318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,
             "A compile time or link error is generated if compute shader built-in variables are redeclared."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_328);
  if (local_328 != (undefined1  [8])local_318) {
    operator_delete((void *)local_328,local_318[0]._M_allocated_capacity + 1);
  }
  log = (pointer)(ctx->super_CallLogWrapper).m_log;
  glu::operator<<((TestLog *)log,(ShaderProgram *)local_3f8);
  if ((bStack_338 == true) && ((local_380->_M_dataplus)._M_p[0x58] == '\x01')) {
    local_328 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_320,"Program was not expected to compile or link.",0x2c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
    std::ios_base::~ios_base(local_2b0);
    local_328 = (undefined1  [8])local_318;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_328,"Program was not expected to compile or link.","");
    NegativeTestContext::fail(ctx,(string *)local_328);
    if (local_328 != (undefined1  [8])local_318) {
      operator_delete((void *)local_328,local_318[0]._M_allocated_capacity + 1);
    }
  }
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void invalid_layout_qualifiers (NegativeTestContext& ctx)
{
	const bool				isES32			= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const char* const		shaderVersion	= isES32
											? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES)
											: getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);

	{
		std::ostringstream compShaderSource;
		compShaderSource	<<	shaderVersion << "\n"
							<<	"void main (void)\n"
							<<	"{\n"
							<<	"}\n";

		const glu::ComputeSource	compSource(compShaderSource.str());
		glu::ShaderProgram			program(ctx.getRenderContext(), glu::ProgramSources() << compSource);

		ctx.beginSection("A link error is generated if the compute shader program does not contain an input layout qualifier specifying a fixed local group size.");
		verifyLinkError(ctx, program);
		ctx.endSection();
	}

	{
		std::ostringstream compShaderSource;
		compShaderSource	<<	shaderVersion << "\n"
							<<	"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
							<<	"layout(local_size_x = 2, local_size_y = 2, local_size_z = 2) in;\n"
							<<	"void main (void)\n"
							<<	"{\n"
							<<	"}\n";

		const glu::ComputeSource	compSource(compShaderSource.str());
		glu::ShaderProgram			program(ctx.getRenderContext(), glu::ProgramSources() << compSource);

		ctx.beginSection("A compile-time error is generated if a local work group size qualifier is declared more than once in the same shader.");
		verifyCompileError(ctx, program, glu::SHADERTYPE_COMPUTE);
		ctx.endSection();
	}

	{
		std::ostringstream compShaderSource;
		compShaderSource	<<	shaderVersion << "\n"
							<<	"out mediump vec4 fragColor;\n"
							<<	"\n"
							<<	"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
							<<	"void main (void)\n"
							<<	"{\n"
							<<	"}\n";

		const glu::ComputeSource	compSource(compShaderSource.str());
		glu::ShaderProgram			program(ctx.getRenderContext(), glu::ProgramSources() << compSource);

		ctx.beginSection("A compile-time error is generated if a user defined output variable is declared in a compute shader.");
		verifyCompileError(ctx, program, glu::SHADERTYPE_COMPUTE);
		ctx.endSection();
	}

	{
		std::ostringstream compShaderSource;
		compShaderSource	<<	shaderVersion << "\n"
							<<	"uvec3 gl_NumWorkGroups;\n"
							<<	"uvec3 gl_WorkGroupSize;\n"
							<<	"uvec3 gl_WorkGroupID;\n"
							<<	"uvec3 gl_LocalInvocationID;\n"
							<<	"uvec3 gl_GlobalInvocationID;\n"
							<<	"uvec3 gl_LocalInvocationIndex;\n"
							<<	"\n"
							<<	"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
							<<	"void main (void)\n"
							<<	"{\n"
							<<	"}\n";

		const glu::ComputeSource	compSource(compShaderSource.str());
		glu::ShaderProgram			program(ctx.getRenderContext(), glu::ProgramSources() << compSource);

		ctx.beginSection("A compile time or link error is generated if compute shader built-in variables are redeclared.");
		bool testFailed = false;

		tcu::TestLog& log = ctx.getLog();
		log << program;

		testFailed = (program.getProgramInfo().linkOk) && (program.getShaderInfo(glu::SHADERTYPE_COMPUTE).compileOk);

		if (testFailed)
		{
			const char* const message("Program was not expected to compile or link.");
			log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
			ctx.fail(message);
		}

		ctx.endSection();
	}
}